

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON_bool cJSON_Compare(cJSON *a,cJSON *b,cJSON_bool case_sensitive)

{
  cJSON_bool cVar1;
  uint uVar2;
  int iVar3;
  cJSON *pcVar4;
  cJSON *local_68;
  cJSON *local_60;
  cJSON *local_48;
  cJSON *b_element_1;
  cJSON *a_element_1;
  cJSON *b_element;
  cJSON *a_element;
  cJSON_bool case_sensitive_local;
  cJSON *b_local;
  cJSON *a_local;
  
  if ((((a == (cJSON *)0x0) || (b == (cJSON *)0x0)) || ((a->type & 0xffU) != (b->type & 0xffU))) ||
     (cVar1 = cJSON_IsInvalid(a), cVar1 != 0)) {
    a_local._4_4_ = 0;
  }
  else {
    uVar2 = (uint)(byte)a->type;
    if (((((uVar2 - 1 < 2) || (uVar2 == 4)) ||
         ((uVar2 == 8 || ((uVar2 == 0x10 || (uVar2 == 0x20)))))) || (uVar2 == 0x40)) ||
       (uVar2 == 0x80)) {
      if (a == b) {
        a_local._4_4_ = 1;
      }
      else {
        uVar2 = (uint)(byte)a->type;
        if ((uVar2 - 1 < 2) || (uVar2 == 4)) {
          a_local._4_4_ = 1;
        }
        else if (uVar2 == 8) {
          if ((a->valuedouble != b->valuedouble) || (NAN(a->valuedouble) || NAN(b->valuedouble))) {
            a_local._4_4_ = 0;
          }
          else {
            a_local._4_4_ = 1;
          }
        }
        else {
          if (uVar2 != 0x10) {
            if (uVar2 == 0x20) {
              a_element_1 = b->child;
              for (b_element = a->child; b_element != (cJSON *)0x0 && a_element_1 != (cJSON *)0x0;
                  b_element = b_element->next) {
                cVar1 = cJSON_Compare(b_element,a_element_1,case_sensitive);
                if (cVar1 == 0) {
                  return 0;
                }
                a_element_1 = a_element_1->next;
              }
              if (b_element != a_element_1) {
                return 0;
              }
              return 1;
            }
            if (uVar2 == 0x40) {
              if (a == (cJSON *)0x0) {
                local_60 = (cJSON *)0x0;
              }
              else {
                local_60 = a->child;
              }
              b_element_1 = local_60;
              while( true ) {
                if (b_element_1 == (cJSON *)0x0) {
                  if (b == (cJSON *)0x0) {
                    local_68 = (cJSON *)0x0;
                  }
                  else {
                    local_68 = b->child;
                  }
                  local_48 = local_68;
                  while( true ) {
                    if (local_48 == (cJSON *)0x0) {
                      return 1;
                    }
                    pcVar4 = get_object_item(a,local_48->string,case_sensitive);
                    if (pcVar4 == (cJSON *)0x0) break;
                    cVar1 = cJSON_Compare(local_48,pcVar4,case_sensitive);
                    if (cVar1 == 0) {
                      return 0;
                    }
                    local_48 = local_48->next;
                  }
                  return 0;
                }
                pcVar4 = get_object_item(b,b_element_1->string,case_sensitive);
                if (pcVar4 == (cJSON *)0x0) {
                  return 0;
                }
                cVar1 = cJSON_Compare(b_element_1,pcVar4,case_sensitive);
                if (cVar1 == 0) break;
                b_element_1 = b_element_1->next;
              }
              return 0;
            }
            if (uVar2 != 0x80) {
              return 0;
            }
          }
          if ((a->valuestring == (char *)0x0) || (b->valuestring == (char *)0x0)) {
            a_local._4_4_ = 0;
          }
          else {
            iVar3 = strcmp(a->valuestring,b->valuestring);
            if (iVar3 == 0) {
              a_local._4_4_ = 1;
            }
            else {
              a_local._4_4_ = 0;
            }
          }
        }
      }
    }
    else {
      a_local._4_4_ = 0;
    }
  }
  return a_local._4_4_;
}

Assistant:

CJSON_PUBLIC(cJSON_bool) cJSON_Compare(const cJSON * const a, const cJSON * const b, const cJSON_bool case_sensitive)
{
    if ((a == NULL) || (b == NULL) || ((a->type & 0xFF) != (b->type & 0xFF)) || cJSON_IsInvalid(a))
    {
        return false;
    }

    /* check if type is valid */
    switch (a->type & 0xFF)
    {
        case cJSON_False:
        case cJSON_True:
        case cJSON_NULL:
        case cJSON_Number:
        case cJSON_String:
        case cJSON_Raw:
        case cJSON_Array:
        case cJSON_Object:
            break;

        default:
            return false;
    }

    /* identical objects are equal */
    if (a == b)
    {
        return true;
    }

    switch (a->type & 0xFF)
    {
        /* in these cases and equal type is enough */
        case cJSON_False:
        case cJSON_True:
        case cJSON_NULL:
            return true;

        case cJSON_Number:
            if (a->valuedouble == b->valuedouble)
            {
                return true;
            }
            return false;

        case cJSON_String:
        case cJSON_Raw:
            if ((a->valuestring == NULL) || (b->valuestring == NULL))
            {
                return false;
            }
            if (strcmp(a->valuestring, b->valuestring) == 0)
            {
                return true;
            }

            return false;

        case cJSON_Array:
        {
            cJSON *a_element = a->child;
            cJSON *b_element = b->child;

            for (; (a_element != NULL) && (b_element != NULL);)
            {
                if (!cJSON_Compare(a_element, b_element, case_sensitive))
                {
                    return false;
                }

                a_element = a_element->next;
                b_element = b_element->next;
            }

            /* one of the arrays is longer than the other */
            if (a_element != b_element) {
                return false;
            }

            return true;
        }

        case cJSON_Object:
        {
            cJSON *a_element = NULL;
            cJSON *b_element = NULL;
            cJSON_ArrayForEach(a_element, a)
            {
                /* TODO This has O(n^2) runtime, which is horrible! */
                b_element = get_object_item(b, a_element->string, case_sensitive);
                if (b_element == NULL)
                {
                    return false;
                }

                if (!cJSON_Compare(a_element, b_element, case_sensitive))
                {
                    return false;
                }
            }

            /* doing this twice, once on a and b to prevent true comparison if a subset of b
             * TODO: Do this the proper way, this is just a fix for now */
            cJSON_ArrayForEach(b_element, b)
            {
                a_element = get_object_item(a, b_element->string, case_sensitive);
                if (a_element == NULL)
                {
                    return false;
                }

                if (!cJSON_Compare(b_element, a_element, case_sensitive))
                {
                    return false;
                }
            }

            return true;
        }

        default:
            return false;
    }
}